

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O3

uint MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI,uint Reg,uint SubIdx,MCRegisterClass *RC)

{
  ushort uVar1;
  MCPhysReg *pMVar2;
  ushort *puVar3;
  uint uVar4;
  uint uVar5;
  
  if ((Reg < RI->NumRegs) && (pMVar2 = RI->DiffLists, pMVar2 != (MCPhysReg *)0x0)) {
    uVar5 = RI->Desc[Reg].SuperRegs;
    if (pMVar2[uVar5] != 0) {
      uVar4 = pMVar2[uVar5] + Reg;
      uVar1 = RC->RegSetSize;
      puVar3 = pMVar2 + uVar5;
      do {
        puVar3 = puVar3 + 1;
        uVar5 = uVar4 & 0xffff;
        if (((uVar5 >> 3 < (uint)uVar1) && ((RC->RegSet[uVar5 >> 3] >> (uVar4 & 7) & 1) != 0)) &&
           (uVar4 = MCRegisterInfo_getSubReg(RI,uVar5,SubIdx), uVar4 == Reg)) {
          return uVar5;
        }
        uVar4 = uVar5 + *puVar3;
      } while (*puVar3 != 0);
    }
  }
  return 0;
}

Assistant:

unsigned MCRegisterInfo_getMatchingSuperReg(const MCRegisterInfo *RI, unsigned Reg, unsigned SubIdx, const MCRegisterClass *RC)
{
	DiffListIterator iter;

	if (Reg >= RI->NumRegs) {
		return 0;
	}

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SuperRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		uint16_t val = DiffListIterator_getVal(&iter);
		if (MCRegisterClass_contains(RC, val) && Reg ==  MCRegisterInfo_getSubReg(RI, val, SubIdx))
			return val;

		DiffListIterator_next(&iter);
	}

	return 0;
}